

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O3

_Bool aux_monster(chunk *c,player *p,target_aux_state *auxst)

{
  _Bool _Var1;
  square *psVar2;
  monster *mon;
  monster_lore *lore;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  object *obj;
  ui_event uVar8;
  char *local_1f8;
  char m_name [80];
  char buf [80];
  char out_val [256];
  
  psVar2 = square((chunk_conflict *)c,auxst->grid);
  if (0 < psVar2->mon) {
    mon = square_monster((chunk_conflict *)c,auxst->grid);
    _Var1 = monster_is_obvious(mon);
    if (_Var1) {
      lore = get_lore(mon->race);
      auxst->boring = false;
      monster_desc(m_name,0x50,mon,L'\b');
      monster_race_track(p->upkeep,mon->race);
      health_track(p->upkeep,mon);
      handle_stuff(p);
      bVar4 = false;
LAB_00208f6f:
      if (bVar4) {
        lore_show_interactive(mon->race,lore);
      }
      else {
        psVar2 = square((chunk_conflict *)c,auxst->grid);
        look_mon_desc(buf,0x50,(int)psVar2->mon);
        if (p->wizard == true) {
          lVar6 = (long)(auxst->grid).y;
          lVar7 = (long)(auxst->grid).x;
          strnfmt(out_val,0x100,"%s%s%s (%s), %s (%d:%d, noise=%d, scent=%d).",auxst->phrase1,
                  auxst->phrase2,m_name,buf,auxst,lVar6,lVar7,(ulong)(c->noise).grids[lVar6][lVar7],
                  (ulong)(c->scent).grids[lVar6][lVar7]);
        }
        else {
          strnfmt(out_val,0x100,"%s%s%s (%s), %s.",auxst->phrase1,auxst->phrase2,m_name,buf,auxst);
        }
        prt(out_val,L'\0',L'\0');
        move_cursor_relative((auxst->grid).y,(auxst->grid).x);
      }
      uVar8 = inkey_m();
      *(mouseclick *)&auxst->press = uVar8.mouse;
      (auxst->press).key.mods = uVar8.key.mods;
      uVar3 = uVar8.key.code;
      if (uVar8.type == EVT_KBRD) {
        if (uVar3 != 0x72) goto LAB_0020910f;
      }
      else {
        if (uVar8.type != EVT_MOUSE) {
LAB_0020910f:
          if ((ulong)uVar8.mouse >> 0x20 == 0x9c) goto LAB_00209124;
          if (uVar3 != 0x20) {
            return true;
          }
LAB_00209104:
          if ((auxst->mode & L'\x02') == L'\0') {
            return true;
          }
LAB_00209124:
          if (p->wizard != true) {
            return false;
          }
          _Var1 = flag_has_dbg(mon->race->flags,0xc,4,"mon->race->flags","RF_FEMALE");
          if (_Var1) {
            local_1f8 = "She is ";
          }
          else {
            _Var1 = flag_has_dbg(mon->race->flags,0xc,3,"mon->race->flags","RF_MALE");
            local_1f8 = "It is ";
            if (_Var1) {
              local_1f8 = "He is ";
            }
          }
          obj = mon->held_obj;
          if (obj == (object *)0x0) {
            return false;
          }
          pcVar5 = "carrying ";
          do {
            object_desc(buf,0x50,obj,0x43,p);
            lVar6 = (long)(auxst->grid).y;
            lVar7 = (long)(auxst->grid).x;
            strnfmt(out_val,0x100,"%s%s%s, %s (%d:%d, noise=%d, scent=%d).",local_1f8,pcVar5,buf,
                    auxst,lVar6,lVar7,(ulong)(c->noise).grids[lVar6][lVar7],
                    (ulong)(c->scent).grids[lVar6][lVar7]);
            prt(out_val,L'\0',L'\0');
            move_cursor_relative((auxst->grid).y,(auxst->grid).x);
            uVar8 = inkey_m();
            *(mouseclick *)&auxst->press = uVar8.mouse;
            (auxst->press).key.mods = uVar8.key.mods;
            if (uVar8.type == EVT_MOUSE) {
              if (uVar8.key.code._2_1_ != '\0') {
                if (uVar8.key.code._2_1_ == '\x02') {
                  return true;
                }
LAB_0020929d:
                if ((auxst->mode & L'\x02') == L'\0') {
                  return true;
                }
              }
            }
            else if ((ulong)uVar8.mouse >> 0x20 != 0x9c) {
              if (uVar8.key.code != 0x20) {
                return true;
              }
              goto LAB_0020929d;
            }
            obj = obj->next;
            pcVar5 = "also carrying ";
            if (obj == (object *)0x0) {
              return false;
            }
          } while( true );
        }
        if (uVar8.key.code._2_1_ != '\x01') {
          if (((undefined1  [12])uVar8 & (undefined1  [12])0xff000000000000) ==
              (undefined1  [12])0x0) goto LAB_00209124;
          if ((uVar8.key.code._2_2_ & 0xff) == 2) {
            return true;
          }
          goto LAB_00209104;
        }
        if (((int)((uVar3 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
             Term->offset_x != (auxst->grid).x) ||
           ((int)((uVar3 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
            Term->offset_y != (auxst->grid).y)) goto LAB_00209104;
      }
      bVar4 = (bool)(bVar4 ^ 1);
      goto LAB_00208f6f;
    }
  }
  return false;
}

Assistant:

static bool aux_monster(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	struct monster *mon;
	const struct monster_lore *lore;
	char m_name[80];
	char out_val[TARGET_OUT_VAL_SIZE];
	bool recall;

	if (square(c, auxst->grid)->mon <= 0) return false;

	mon = square_monster(c, auxst->grid);
	if (!monster_is_obvious(mon)) return false;

	/* Actual visible monsters */
	lore = get_lore(mon->race);

	/* Not boring */
	auxst->boring = false;

	/* Get the monster name ("a kobold") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_IND_VIS);

	/* Track this monster's race and health */
	monster_race_track(p->upkeep, mon->race);
	health_track(p->upkeep, mon);
	handle_stuff(p);

	/* Interact */
	recall = false;
	while (1) {
		/* Recall or target */
		if (recall) {
			lore_show_interactive(mon->race, lore);
			auxst->press = inkey_m();
		} else {
			char buf[80];

			/* Describe the monster */
			look_mon_desc(buf, sizeof(buf),
				square(c, auxst->grid)->mon);

			/* Describe, and prompt for recall */
			if (p->wizard) {
				strnfmt(out_val, sizeof(out_val),
					"%s%s%s (%s), %s (%d:%d, noise=%d, scent=%d).",
					auxst->phrase1,
					auxst->phrase2,
					m_name,
					buf,
					auxst->coord_desc,
					auxst->grid.y,
					auxst->grid.x,
					(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
					(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
			} else {
				strnfmt(out_val, sizeof(out_val),
					"%s%s%s (%s), %s.",
					auxst->phrase1,
					auxst->phrase2,
					m_name,
					buf,
					auxst->coord_desc);
			}

			prt(out_val, 0, 0);

			/* Place cursor */
			move_cursor_relative(auxst->grid.y, auxst->grid.x);

			/* Command */
			auxst->press = inkey_m();
		}

		/* Normal commands */
		if (auxst->press.type == EVT_MOUSE
				&& auxst->press.mouse.button == 1
				&& KEY_GRID_X(auxst->press) == auxst->grid.x
				&& KEY_GRID_Y(auxst->press) == auxst->grid.y) {
			recall = !recall;
		} else if (auxst->press.type == EVT_KBRD
				&& auxst->press.key.code == 'r') {
			recall = !recall;
		} else {
			break;
		}
	}

	if (auxst->press.type == EVT_MOUSE) {
		/* Stop on right click */
		if (auxst->press.mouse.button == 2) return true;

		/* Sometimes stop at "space" key */
		if (auxst->press.mouse.button
				&& !(auxst->mode & (TARGET_LOOK))) return true;
	} else {
		/* Stop on everything but "return"/"space" */
		if (auxst->press.key.code != KC_ENTER
				&& auxst->press.key.code != ' ') return true;

		/* Sometimes stop at "space" key */
		if (auxst->press.key.code == ' '
				&& !(auxst->mode & (TARGET_LOOK))) return true;
	}

	/* Describe carried objects (wizards only) */
	if (p->wizard) {
		const char *lphrase1;
		const char *lphrase2;
		struct object *obj;

		/* Take account of gender */
		if (rf_has(mon->race->flags, RF_FEMALE)) {
			lphrase1 = "She is ";
		} else if (rf_has(mon->race->flags, RF_MALE)) {
			lphrase1 = "He is ";
		} else {
			lphrase1 = "It is ";
		}

		/* Use a verb */
		lphrase2 = "carrying ";

		/* Scan all objects being carried */
		for (obj = mon->held_obj; obj; obj = obj->next) {
			char o_name[80];

			/* Obtain an object description */
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, p);

			strnfmt(out_val, sizeof(out_val),
				"%s%s%s, %s (%d:%d, noise=%d, scent=%d).",
				lphrase1,
				lphrase2,
				o_name,
				auxst->coord_desc,
				auxst->grid.y,
				auxst->grid.x,
				(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
				(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);

			prt(out_val, 0, 0);
			move_cursor_relative(auxst->grid.y, auxst->grid.x);
			auxst->press = inkey_m();

			if (auxst->press.type == EVT_MOUSE) {
				/* Stop on right click */
				if (auxst->press.mouse.button == 2) break;

				/* Sometimes stop at "space" key */
				if (auxst->press.mouse.button
						&& !(auxst->mode & (TARGET_LOOK)))
					break;
			} else {
				/* Stop on everything but "return"/"space" */
				if (auxst->press.key.code != KC_ENTER
						&& auxst->press.key.code != ' ')
					break;

				/* Sometimes stop at "space" key */
				if (auxst->press.key.code == ' '
						&& !(auxst->mode & (TARGET_LOOK)))
					break;
			}

			/* Change the intro */
			lphrase2 = "also carrying ";
		}

		/* Double break */
		if (obj) return true;
	}

	return false;
}